

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rtreeClose(sqlite3_vtab_cursor *cur)

{
  Rtree *pRtree_00;
  RtreeCursor *pCsr;
  int ii;
  Rtree *pRtree;
  sqlite3_vtab_cursor *cur_local;
  
  pRtree_00 = (Rtree *)cur->pVtab;
  freeCursorConstraints((RtreeCursor *)cur);
  sqlite3_finalize((sqlite3_stmt *)cur[7].pVtab);
  sqlite3_free(cur[6].pVtab);
  for (pCsr._4_4_ = 0; pCsr._4_4_ < 5; pCsr._4_4_ = pCsr._4_4_ + 1) {
    nodeRelease(pRtree_00,(RtreeNode *)cur[(long)pCsr._4_4_ + 0xb].pVtab);
  }
  sqlite3_free(cur);
  pRtree_00->nCursor = pRtree_00->nCursor - 1;
  nodeBlobReset(pRtree_00);
  return 0;
}

Assistant:

static int rtreeClose(sqlite3_vtab_cursor *cur){
  Rtree *pRtree = (Rtree *)(cur->pVtab);
  int ii;
  RtreeCursor *pCsr = (RtreeCursor *)cur;
  assert( pRtree->nCursor>0 );
  freeCursorConstraints(pCsr);
  sqlite3_finalize(pCsr->pReadAux);
  sqlite3_free(pCsr->aPoint);
  for(ii=0; ii<RTREE_CACHE_SZ; ii++) nodeRelease(pRtree, pCsr->aNode[ii]);
  sqlite3_free(pCsr);
  pRtree->nCursor--;
  nodeBlobReset(pRtree);
  return SQLITE_OK;
}